

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::(anonymous_namespace)::DynamicMessageTest_PackedFields_Test::
~DynamicMessageTest_PackedFields_Test(DynamicMessageTest_PackedFields_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__DynamicMessageTest_0188d858;
  *(undefined ***)this = &PTR__DynamicMessageTest_0188d898;
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)(this + 0x80));
  DescriptorPool::~DescriptorPool((DescriptorPool *)(this + 8));
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x130);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, PackedFields) {
  // Check that packed fields work properly.
  Arena arena;
  Message* message = packed_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(packed_descriptor_);

  reflection_tester.SetPackedFieldsViaReflection(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}